

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colGc.c
# Opt level: O3

void Col_ResumeGC(void)

{
  long lVar1;
  GroupData *data;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  
  pvVar2 = pthread_getspecific(tsdKey);
  lVar1 = *(long *)((long)pvVar2 + 0x20);
  if (lVar1 == 1) {
    data = *(GroupData **)((long)pvVar2 + 8);
    uVar4 = data->pools[0].nbPages / 10;
    if (0x3ff < uVar4) {
      uVar4 = 0x400;
    }
    uVar3 = 0x40;
    if (0x40 < uVar4) {
      uVar3 = uVar4;
    }
    if (data->model == 0) {
      if (uVar3 <= *(ulong *)((long)pvVar2 + 0x440)) {
        PerformGC(data);
      }
    }
    else {
      PlatSyncResumeGC(data,(uint)(uVar3 <= *(ulong *)((long)pvVar2 + 0x440)));
    }
    *(undefined8 *)((long)pvVar2 + 0x20) = 0;
  }
  else {
    if (lVar1 == 0) {
      Col_Error(COL_ERROR,ColibriDomain,3);
      return;
    }
    *(long *)((long)pvVar2 + 0x20) = lVar1 + -1;
  }
  return;
}

Assistant:

void
Col_ResumeGC()
{
    ThreadData *data = PlatGetThreadData();

    /*
     * Check preconditions.
     */

    /*! @error{COL_ERROR_GCPROTECT} */
    PRECONDITION_GCPROTECTED(data) return;

    if (data->pauseGC > 1) {
        /*
         * Within nested sections.
         */

        data->pauseGC--;
        return;
    } else {
        /*
         * Leaving protected section.
         */

        size_t threshold = data->groupData->pools[0].nbPages / GC_GEN_FACTOR;

        /*
         * GC is needed when the number of pages allocated since the last GC
         * exceed a given threshold.
         */

        int performGc = (data->eden.nbAlloc >= GC_THRESHOLD(threshold));
        ASSERT(data->pauseGC == 1);
        SyncResumeGC(data->groupData, performGc);
        data->pauseGC = 0;
    }
}